

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnv.cpp
# Opt level: O2

int32_t ucnv_fromUChars_63(UConverter *cnv,char *dest,int32_t destCapacity,UChar *src,
                          int32_t srcLength,UErrorCode *pErrorCode)

{
  UErrorCode UVar1;
  UChar *pUVar2;
  UChar *pUVar3;
  int32_t iVar4;
  int iVar5;
  int iVar6;
  char *dest_local;
  UChar *src_local;
  UChar *local_440;
  char buffer [1024];
  char local_38 [8];
  
  iVar4 = 0;
  if ((pErrorCode != (UErrorCode *)0x0) && (iVar4 = 0, *pErrorCode < U_ILLEGAL_ARGUMENT_ERROR)) {
    if ((destCapacity < 0 || cnv == (UConverter *)0x0) ||
       ((srcLength < -1 || dest == (char *)0x0 && destCapacity != 0 ||
        (src == (UChar *)0x0 && srcLength != 0)))) {
      *pErrorCode = U_ILLEGAL_ARGUMENT_ERROR;
      iVar4 = 0;
    }
    else {
      dest_local = dest;
      src_local = src;
      ucnv_resetFromUnicode_63(cnv);
      if (srcLength == -1) {
        srcLength = u_strlen_63(src);
      }
      if (srcLength < 1) {
        iVar6 = 0;
        pUVar2 = local_440;
      }
      else {
        iVar6 = (int)dest;
        if (destCapacity == 0) {
          destCapacity = 0;
        }
        else {
          iVar5 = -1;
          if (dest < (char *)0xffffffff80000001) {
            iVar5 = iVar6 + 0x7fffffff;
          }
          if (iVar5 - iVar6 < destCapacity) {
            destCapacity = iVar5 - iVar6;
          }
        }
        ucnv_fromUnicode_63(cnv,&dest_local,dest + destCapacity,&src_local,src + (uint)srcLength,
                            (int32_t *)0x0,'\x01',pErrorCode);
        iVar6 = (int)dest_local - iVar6;
        UVar1 = *pErrorCode;
        pUVar3 = src + (uint)srcLength;
        pUVar2 = local_440;
        while (local_440 = pUVar3, UVar1 == U_BUFFER_OVERFLOW_ERROR) {
          *pErrorCode = U_ZERO_ERROR;
          dest_local = buffer;
          ucnv_fromUnicode_63(cnv,&dest_local,local_38,&src_local,local_440,(int32_t *)0x0,'\x01',
                              pErrorCode);
          iVar6 = iVar6 + ((int)dest_local - (int)buffer);
          pUVar3 = local_440;
          pUVar2 = local_440;
          UVar1 = *pErrorCode;
        }
      }
      local_440 = pUVar2;
      iVar4 = u_terminateChars_63(dest,destCapacity,iVar6,pErrorCode);
    }
  }
  return iVar4;
}

Assistant:

U_CAPI int32_t U_EXPORT2
ucnv_fromUChars(UConverter *cnv,
                char *dest, int32_t destCapacity,
                const UChar *src, int32_t srcLength,
                UErrorCode *pErrorCode) {
    const UChar *srcLimit;
    char *originalDest, *destLimit;
    int32_t destLength;

    /* check arguments */
    if(pErrorCode==NULL || U_FAILURE(*pErrorCode)) {
        return 0;
    }

    if( cnv==NULL ||
        destCapacity<0 || (destCapacity>0 && dest==NULL) ||
        srcLength<-1 || (srcLength!=0 && src==NULL)
    ) {
        *pErrorCode=U_ILLEGAL_ARGUMENT_ERROR;
        return 0;
    }

    /* initialize */
    ucnv_resetFromUnicode(cnv);
    originalDest=dest;
    if(srcLength==-1) {
        srcLength=u_strlen(src);
    }
    if(srcLength>0) {
        srcLimit=src+srcLength;
        destCapacity=pinCapacity(dest, destCapacity);
        destLimit=dest+destCapacity;

        /* perform the conversion */
        ucnv_fromUnicode(cnv, &dest, destLimit, &src, srcLimit, 0, TRUE, pErrorCode);
        destLength=(int32_t)(dest-originalDest);

        /* if an overflow occurs, then get the preflighting length */
        if(*pErrorCode==U_BUFFER_OVERFLOW_ERROR) {
            char buffer[1024];

            destLimit=buffer+sizeof(buffer);
            do {
                dest=buffer;
                *pErrorCode=U_ZERO_ERROR;
                ucnv_fromUnicode(cnv, &dest, destLimit, &src, srcLimit, 0, TRUE, pErrorCode);
                destLength+=(int32_t)(dest-buffer);
            } while(*pErrorCode==U_BUFFER_OVERFLOW_ERROR);
        }
    } else {
        destLength=0;
    }

    return u_terminateChars(originalDest, destCapacity, destLength, pErrorCode);
}